

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kurtosis.cpp
# Opt level: O3

void duckdb::KurtosisOperation<duckdb::KurtosisFlagBiasCorrection>::
     Finalize<double,duckdb::KurtosisState>
               (KurtosisState *state,double *target,AggregateFinalizeData *finalize_data)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  bool bVar4;
  OutOfRangeException *this;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  double __x;
  string local_40;
  
  uVar3 = state->n;
  if (3 < uVar3) {
    auVar8._8_4_ = (int)(uVar3 >> 0x20);
    auVar8._0_8_ = uVar3;
    auVar8._12_4_ = 0x45300000;
    dVar11 = (auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
    __x = 1.0 / dVar11;
    dVar7 = state->sum;
    dVar1 = state->sum_sqr;
    dVar10 = dVar1 - dVar7 * dVar7 * __x;
    if ((dVar10 != 0.0) || (NAN(dVar10))) {
      dVar10 = dVar1 - dVar7 * dVar7 * __x;
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        dVar10 = state->sum_cub;
        dVar2 = state->sum_four;
        dVar5 = pow(dVar7,4.0);
        dVar6 = pow(__x,3.0);
        dVar9 = (state->sum_sqr - state->sum * state->sum * __x) * __x;
        if (0.0 < dVar9) {
          dVar7 = (((dVar11 + -1.0) * -3.0 +
                   ((dVar11 + 1.0) *
                   (dVar5 * -3.0 * dVar6 +
                   dVar1 * 6.0 * dVar7 * dVar7 * __x * __x + dVar10 * -4.0 * dVar7 * __x + dVar2) *
                   __x) / (dVar9 * dVar9)) * (dVar11 + -1.0)) / ((dVar11 + -3.0) * (dVar11 + -2.0));
          *target = dVar7;
          bVar4 = Value::DoubleIsFinite(dVar7);
          if (bVar4) {
            return;
          }
          this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,"Kurtosis is out of range!","");
          OutOfRangeException::OutOfRangeException(this,&local_40);
          __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    }
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, TARGET_TYPE &target, AggregateFinalizeData &finalize_data) {
		auto n = (double)state.n;
		if (n <= 1) {
			finalize_data.ReturnNull();
			return;
		}
		if (std::is_same<KURTOSIS_FLAG, KurtosisFlagBiasCorrection>::value && n <= 3) {
			finalize_data.ReturnNull();
			return;
		}
		double temp = 1 / n;
		//! This is necessary due to linux 32 bits
		long double temp_aux = 1 / n;
		if (state.sum_sqr - state.sum * state.sum * temp == 0 ||
		    state.sum_sqr - state.sum * state.sum * temp_aux == 0) {
			finalize_data.ReturnNull();
			return;
		}
		double m4 =
		    temp * (state.sum_four - 4 * state.sum_cub * state.sum * temp +
		            6 * state.sum_sqr * state.sum * state.sum * temp * temp - 3 * pow(state.sum, 4) * pow(temp, 3));

		double m2 = temp * (state.sum_sqr - state.sum * state.sum * temp);
		if (m2 <= 0) { // m2 shouldn't be below 0 but floating points are weird
			finalize_data.ReturnNull();
			return;
		}
		if (std::is_same<KURTOSIS_FLAG, KurtosisFlagNoBiasCorrection>::value) {
			target = m4 / (m2 * m2) - 3;
		} else {
			target = (n - 1) * ((n + 1) * m4 / (m2 * m2) - 3 * (n - 1)) / ((n - 2) * (n - 3));
		}
		if (!Value::DoubleIsFinite(target)) {
			throw OutOfRangeException("Kurtosis is out of range!");
		}
	}